

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

int __thiscall FNodeBuilder::FVertexMap::SelectVertexClose(FVertexMap *this,FPrivVert *vert)

{
  int iVar1;
  int iVar2;
  FPrivVert *pFVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  iVar4 = (vert->super_FSimpleVert).x;
  if (iVar4 < this->MinX) {
    __assert_fail("x >= MinX",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild.h"
                  ,0x9d,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
  }
  iVar1 = (vert->super_FSimpleVert).y;
  if (iVar1 < this->MinY) {
    __assert_fail("y >= MinY",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild.h"
                  ,0x9e,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
  }
  if (this->MaxX < iVar4) {
    __assert_fail("x <= MaxX",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild.h"
                  ,0x9f,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
  }
  if (iVar1 <= this->MaxY) {
    iVar6 = ((uint)(iVar1 - this->MinY) >> 0x18) * this->BlocksWide +
            ((uint)(iVar4 - this->MinX) >> 0x18);
    uVar7 = (ulong)this->VertexGrid[iVar6].Count;
    if (uVar7 != 0) {
      pFVar3 = (this->MyBuilder->Vertices).Array;
      uVar8 = 0;
      do {
        iVar2 = this->VertexGrid[iVar6].Array[uVar8];
        uVar5 = pFVar3[iVar2].super_FSimpleVert.x - iVar4;
        uVar9 = -uVar5;
        if (0 < (int)uVar5) {
          uVar9 = uVar5;
        }
        if (uVar9 < 6) {
          uVar5 = pFVar3[iVar2].super_FSimpleVert.y - iVar1;
          uVar9 = -uVar5;
          if (0 < (int)uVar5) {
            uVar9 = uVar5;
          }
          if (uVar9 < 6) {
            return iVar2;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    iVar4 = InsertVertex(this,vert);
    return iVar4;
  }
  __assert_fail("y <= MaxY",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/nodebuild.h"
                ,0xa0,"int FNodeBuilder::FVertexMap::GetBlock(fixed_t, fixed_t)");
}

Assistant:

int FNodeBuilder::FVertexMap::SelectVertexClose (FNodeBuilder::FPrivVert &vert)
{
	TArray<int> &block = VertexGrid[GetBlock (vert.x, vert.y)];
	FPrivVert *vertices = &MyBuilder.Vertices[0];
	unsigned int i;

	for (i = 0; i < block.Size(); ++i)
	{
#if VERTEX_EPSILON <= 1
		if (vertices[block[i]].x == vert.x && vertices[block[i]].y == vert.y)
#else
		if (abs(vertices[block[i]].x - vert.x) < VERTEX_EPSILON &&
			abs(vertices[block[i]].y - vert.y) < VERTEX_EPSILON)
#endif
		{
			return block[i];
		}
	}

	// Not present: add it!
	return InsertVertex (vert);
}